

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

Vector<float,_16> *
deqp::gles3::Performance::combineVec4ToVec16
          (Vector<float,_16> *__return_storage_ptr__,Vec4 *a0,Vec4 *a1,Vec4 *a2,Vec4 *a3)

{
  float fVar1;
  float *pfVar2;
  Vec4 *local_70;
  Vec4 *local_68;
  Vec4 *local_60;
  int local_44;
  int i;
  Vec4 *srcVec;
  int vecNdx;
  Vec4 *a3_local;
  Vec4 *a2_local;
  Vec4 *a1_local;
  Vec4 *a0_local;
  Vector<float,_16> *result;
  
  tcu::Vector<float,_16>::Vector(__return_storage_ptr__);
  for (srcVec._4_4_ = 0; srcVec._4_4_ < 4; srcVec._4_4_ = srcVec._4_4_ + 1) {
    local_60 = a0;
    if (srcVec._4_4_ != 0) {
      local_68 = a1;
      if (srcVec._4_4_ != 1) {
        local_70 = a3;
        if (srcVec._4_4_ == 2) {
          local_70 = a2;
        }
        local_68 = local_70;
      }
      local_60 = local_68;
    }
    for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
      pfVar2 = tcu::Vector<float,_4>::operator[](local_60,local_44);
      fVar1 = *pfVar2;
      pfVar2 = tcu::Vector<float,_16>::operator[]
                         (__return_storage_ptr__,srcVec._4_4_ * 4 + local_44);
      *pfVar2 = fVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static tcu::Vector<float, 16> combineVec4ToVec16 (const Vec4& a0, const Vec4& a1, const Vec4& a2, const Vec4& a3)
{
	tcu::Vector<float, 16> result;

	for (int vecNdx = 0; vecNdx < 4; vecNdx++)
	{
		const Vec4& srcVec = vecNdx == 0 ? a0 : vecNdx == 1 ? a1 : vecNdx == 2 ? a2 : a3;
		for (int i = 0; i < 4; i++)
			result[vecNdx*4 + i] = srcVec[i];
	}

	return result;
}